

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O0

void __thiscall
siamese::RecoveryMatrixState::PopulateColumns
          (RecoveryMatrixState *this,uint oldColumns,uint newColumns)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  reference pvVar4;
  long *plVar5;
  uint in_EDX;
  uint in_ESI;
  array<siamese::OriginalPacket,_64UL> *in_RDI;
  ColumnInfo *columnPtr;
  uint element;
  DecoderSubwindow *subwindowPtr;
  uint column;
  uint bitIndex;
  uint subwindowIndex;
  uint subwindowEnd;
  uint elementEnd;
  uint elementStart;
  size_type in_stack_ffffffffffffff78;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_4c;
  uint in_stack_ffffffffffffffe4;
  LightVector<siamese::RecoveryMatrixState::ColumnInfo,_25U> *in_stack_ffffffffffffffe8;
  
  if (in_ESI < in_EDX) {
    pktalloc::LightVector<siamese::RecoveryMatrixState::ColumnInfo,_25U>::SetSize_Copy
              (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
    local_4c = in_RDI->_M_elems[0x24].Buffer.Bytes;
    in_RDI->_M_elems[0x24].Buffer.Bytes = *(uint *)(*(long *)&in_RDI->_M_elems[0].Column + 0x20);
    iVar1 = *(int *)(*(long *)&in_RDI->_M_elems[0].Column + 0x20);
    if (local_4c < *(uint *)(*(long *)&in_RDI->_M_elems[0].Column + 8)) {
      local_4c = *(uint *)(*(long *)&in_RDI->_M_elems[0].Column + 8);
    }
    local_5c = local_4c & 0x3f;
    local_60 = in_ESI;
    for (local_58 = local_4c >> 6; local_58 < iVar1 + 0x3fU >> 6; local_58 = local_58 + 1) {
      lVar2 = *(long *)(*(long *)(*(long *)&in_RDI->_M_elems[0].Buffer.Bytes + 0x108) +
                       (long)(int)local_58 * 8);
      uVar3 = *(uint *)(lVar2 + 0x608);
      while ((uVar3 < 0x40 &&
             (local_5c = pktalloc::CustomBitSet<64U>::FindFirstClear
                                   ((CustomBitSet<64U> *)(lVar2 + 0x600),local_5c), local_5c < 0x40)
             )) {
        plVar5 = (long *)(*(long *)&in_RDI->_M_elems[0x23].Column + (long)(int)local_60 * 0x10);
        *(uint *)(plVar5 + 1) =
             local_58 * 0x40 + local_5c +
             *(int *)(*(long *)&in_RDI->_M_elems[0].Buffer.Bytes + 0x2c) & 0x3fffff;
        pvVar4 = std::array<siamese::OriginalPacket,_64UL>::operator[]
                           (in_RDI,in_stack_ffffffffffffff78);
        *plVar5 = (long)pvVar4;
        *(char *)((long)plVar5 + 0xc) = (char)((ulong)(uint)((int)plVar5[1] * 199) % 0xfd) + '\x03';
        *(uint *)(*plVar5 + 0x10) = local_60;
        local_60 = local_60 + 1;
        if (in_EDX <= local_60) {
          return;
        }
        local_5c = local_5c + 1;
        uVar3 = local_5c;
      }
      local_5c = 0;
    }
    *(undefined1 *)(*(long *)&in_RDI->_M_elems[0].Buffer.Bytes + 0x668) = 1;
  }
  return;
}

Assistant:

void RecoveryMatrixState::PopulateColumns(const unsigned oldColumns, const unsigned newColumns)
{
    if (oldColumns >= newColumns)
        return;

    Columns.SetSize_Copy(newColumns);

    // Resume adding from the last stop point
    unsigned elementStart     = PreviousNextCheckStart;
    PreviousNextCheckStart    = CheckedRegion->NextCheckStart;
    const unsigned elementEnd = CheckedRegion->NextCheckStart;
    if (elementStart < CheckedRegion->ElementStart)
        elementStart = CheckedRegion->ElementStart;

    // The column count increased which means we should have some columns to check
    SIAMESE_DEBUG_ASSERT(elementStart < elementEnd);

    // Check the current subwindow for next lost packet:
    const unsigned subwindowEnd = (elementEnd + kSubwindowSize - 1) / kSubwindowSize;
    unsigned subwindowIndex     = elementStart / kSubwindowSize;

    unsigned bitIndex = elementStart % kSubwindowSize;
    unsigned column   = oldColumns;

    while (subwindowIndex < subwindowEnd)
    {
        SIAMESE_DEBUG_ASSERT(subwindowIndex < Window->Subwindows.GetSize());

        DecoderSubwindow* subwindowPtr = Window->Subwindows.GetRef(subwindowIndex);

        // If there may be any lost packets in this subwindow:
        if (subwindowPtr->GotCount < kSubwindowSize)
        {
            do
            {
                // Seek next clear bit
                bitIndex = subwindowPtr->Got.FindFirstClear(bitIndex);

                // If there were none, skip this subwindow
                if (bitIndex >= kSubwindowSize)
                    break;

                // Calculate element index and stop if we hit the end of the valid data
                const unsigned element = subwindowIndex * kSubwindowSize + bitIndex;
                SIAMESE_DEBUG_ASSERT(element < elementEnd);

                ColumnInfo* columnPtr = Columns.GetPtr(column);
                columnPtr->Column     = Window->ElementToColumn(element);
                columnPtr->Original   = &subwindowPtr->Originals[bitIndex];
                columnPtr->CX         = GetColumnValue(columnPtr->Column);

                // Point lost original packet to recovery matrix column
                SIAMESE_DEBUG_ASSERT(columnPtr->Original->Buffer.Bytes == 0);
                columnPtr->Original->Column = column;

                // If we just added the last column:
                if (++column >= newColumns)
                    return;

            } while (++bitIndex < kSubwindowSize);
        }

        // Reset bit index to the front of the next subwindow
        bitIndex = 0;

        // Check next subwindow
        ++subwindowIndex;
    }

    SIAMESE_DEBUG_BREAK(); // Should never get here
    Window->EmergencyDisabled = true;
}